

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O3

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::MouseEvent,QWindow*,unsigned_long,QPointF,QPointF,QFlags<Qt::MouseButton>,QFlags<Qt::KeyboardModifier>,Qt::MouseButton,QEvent::Type,Qt::MouseEventSource,bool,QPointingDevice_const*>
               (QWindow *args,unsigned_long args_1,QPointF args_2,QPointF args_3,
               QFlags<Qt::MouseButton> args_4,QFlags<Qt::KeyboardModifier> args_5,MouseButton args_6
               ,Type args_7,MouseEventSource args_8,bool args_9,QPointingDevice *args_10)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  undefined1 uVar5;
  undefined8 *puVar6;
  WindowSystemEvent *pWVar7;
  int *piVar8;
  long in_FS_OFFSET;
  byte bVar9;
  WindowSystemEvent local_b0;
  int *local_98;
  QWindow *local_90;
  unsigned_long local_88;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_80;
  QPointingDevice *local_78;
  qreal local_70;
  qreal local_68;
  qreal local_60;
  qreal local_58;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_50;
  MouseEventSource local_4c;
  undefined1 local_48;
  MouseButton local_44;
  Type local_40;
  undefined4 local_3c;
  long local_38;
  
  bVar9 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QThread::isMainThread();
  if (cVar1 == '\0') {
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::MouseEvent,QWindow*,unsigned_long,QPointF,QPointF,QFlags<Qt::MouseButton>,QFlags<Qt::KeyboardModifier>,Qt::MouseButton,QEvent::Type,Qt::MouseEventSource,bool,QPointingDevice_const*>
              (args,args_1,args_2,args_3,args_4,args_5,args_6,args_7,args_8,args_9,args_10);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      bVar2 = QWindowSystemInterface::flushWindowSystemEvents((ProcessEventsFlags)0x0);
      return bVar2;
    }
  }
  else {
    puVar6 = &DAT_0068f128;
    pWVar7 = &local_b0;
    for (lVar4 = 0xe; lVar4 != 0; lVar4 = lVar4 + -1) {
      pWVar7->_vptr_WindowSystemEvent = (_func_int **)*puVar6;
      puVar6 = puVar6 + (ulong)bVar9 * -2 + 1;
      pWVar7 = (WindowSystemEvent *)((long)pWVar7 + ((ulong)bVar9 * -2 + 1) * 8);
    }
    local_b0.type = Mouse;
    local_b0.flags = 0;
    local_b0.eventAccepted = true;
    if (args == (QWindow *)0x0) {
      local_b0.type = Mouse;
      local_b0.flags = 2;
      local_98 = (int *)0x0;
    }
    else {
      local_98 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&args->super_QObject);
    }
    local_78 = args_10;
    local_b0._vptr_WindowSystemEvent = (_func_int **)&PTR__UserEvent_007d4160;
    local_4c = args_8;
    local_48 = args_9;
    local_3c = 0xffffffff;
    local_90 = args;
    local_88 = args_1;
    local_80.super_QFlagsStorage<Qt::KeyboardModifier>.i =
         (QFlagsStorage<Qt::KeyboardModifier>)
         (QFlagsStorage<Qt::KeyboardModifier>)
         args_5.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
         super_QFlagsStorage<Qt::KeyboardModifier>.i;
    local_70 = args_2.xp;
    local_68 = args_2.yp;
    local_60 = args_3.xp;
    local_58 = args_3.yp;
    local_50.super_QFlagsStorage<Qt::MouseButton>.i =
         (QFlagsStorage<Qt::MouseButton>)
         (QFlagsStorage<Qt::MouseButton>)
         args_4.super_QFlagsStorageHelper<Qt::MouseButton,_4>.super_QFlagsStorage<Qt::MouseButton>.i
    ;
    local_44 = args_6;
    local_40 = args_7;
    if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
      QGuiApplicationPrivate::processWindowSystemEvent(&local_b0);
      uVar5 = local_b0.eventAccepted;
    }
    else {
      iVar3 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                        (QWindowSystemInterfacePrivate::eventHandler,&local_b0);
      uVar5 = local_b0.eventAccepted;
      if ((char)iVar3 == '\0') {
        uVar5 = 0;
      }
    }
    local_b0._vptr_WindowSystemEvent = (_func_int **)&PTR__UserEvent_007d41f0;
    if (local_98 != (int *)0x0) {
      LOCK();
      *local_98 = *local_98 + -1;
      UNLOCK();
      if (*local_98 == 0) {
        piVar8 = local_98;
        if (local_98 == (int *)0x0) {
          piVar8 = (int *)0x0;
        }
        operator_delete(piVar8);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (bool)uVar5;
    }
  }
  __stack_chk_fail();
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}